

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.c
# Opt level: O3

int main(void)

{
  uint32_t *puVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 __s2;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  char *__format;
  uint32_t derive_child_num;
  char **in_R8;
  size_t in_R9;
  undefined8 unaff_R12;
  bool bVar14;
  long lVar15;
  char *hex;
  uint local_26c;
  wally_descriptor_address_list_test *local_268;
  size_t written;
  char *local_258;
  uint local_24c;
  char *local_248;
  ulong local_240;
  uchar script [520];
  
  uVar11 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  lVar15 = 0;
  do {
    pcVar13 = *(char **)((long)&g_miniscript_ref_test_table[0].miniscript + lVar15);
    _Var4 = check_parse_miniscript
                      (pcVar13,pcVar13,
                       *(char **)((long)&g_miniscript_ref_test_table[0].scriptpubkey + lVar15),
                       (char **)0x0,in_R8,in_R9,(uint32_t)hex);
    if (!_Var4) {
      uVar11 = 0;
      printf("[%s] test failed!\n",
             *(undefined8 *)((long)&g_miniscript_ref_test_table[0].miniscript + lVar15));
    }
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x1d0);
  lVar15 = 0;
  do {
    _Var4 = check_parse_miniscript
                      (*(char **)((long)&g_miniscript_test_table[0].name + lVar15),
                       *(char **)((long)&g_miniscript_test_table[0].descriptor + lVar15),
                       *(char **)((long)&g_miniscript_test_table[0].scriptpubkey + lVar15),
                       (char **)0x0,in_R8,in_R9,(uint32_t)hex);
    if (!_Var4) {
      uVar11 = 0;
      printf("[%s] test failed!\n",*(undefined8 *)((long)&g_miniscript_test_table[0].name + lVar15))
      ;
    }
    lVar15 = lVar15 + 0x28;
  } while (lVar15 != 600);
  lVar15 = 0;
  do {
    pcVar13 = *(char **)((long)&g_miniscript_taproot_test_table[0].miniscript + lVar15);
    _Var4 = check_parse_miniscript
                      (pcVar13,pcVar13,
                       *(char **)((long)&g_miniscript_taproot_test_table[0].scriptpubkey + lVar15),
                       (char **)(ulong)*(uint *)((long)&g_miniscript_taproot_test_table[0].flags +
                                                lVar15),in_R8,in_R9,(uint32_t)hex);
    if (!_Var4) {
      uVar11 = 0;
      printf("[%s] test failed!\n",
             *(undefined8 *)((long)&g_miniscript_taproot_test_table[0].miniscript + lVar15));
    }
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x48);
  lVar15 = 0;
  do {
    local_26c = (uint)uVar11;
    local_268 = *(wally_descriptor_address_list_test **)
                 ((long)&g_descriptor_test_table[0].name + lVar15);
    pcVar13 = *(char **)((long)&g_descriptor_test_table[0].descriptor + lVar15);
    pcVar9 = *(char **)((long)&g_descriptor_test_table[0].scriptpubkey + lVar15);
    puVar1 = *(uint32_t **)((long)&g_descriptor_test_table[0].bip32_index + lVar15);
    local_258 = *(char **)((long)&g_descriptor_test_table[0].checksum + lVar15);
    written = 0;
    hex = (char *)0x0;
    local_248 = (char *)0x0;
    derive_child_num = 0;
    if (puVar1 != (uint32_t *)0x0) {
      derive_child_num = *puVar1;
    }
    uVar5 = wally_descriptor_to_scriptpubkey
                      (pcVar13,g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,
                       derive_child_num,0,0,0,0,script,0x208,&written);
    if (uVar5 == 0) {
      uVar5 = wally_hex_from_bytes(script,written,&hex);
      if (uVar5 != 0) {
        pcVar13 = "wally_hex_from_bytes NG[%d]\n";
        goto LAB_00106af6;
      }
      uVar5 = wally_descriptor_create_checksum
                        (pcVar13,g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,0,
                         &local_248);
      pcVar2 = hex;
      if (uVar5 != 0) {
        printf("wally_descriptor_create_checksum NG[%d]\n",(ulong)uVar5);
LAB_00106bd5:
        wally_free_string(hex);
        goto LAB_00106aff;
      }
      sVar8 = strlen(hex);
      iVar7 = strncmp(pcVar2,pcVar9,sVar8 + 1);
      pcVar9 = local_248;
      if (iVar7 != 0) {
        __format = "%s:\n  Input: %s\n  Output: %s\n";
        pcVar9 = pcVar2;
LAB_00106bc4:
        printf(__format,local_268,pcVar13,pcVar9);
        wally_free_string(local_248);
        goto LAB_00106bd5;
      }
      iVar7 = strncmp(local_248,local_258,9);
      if (iVar7 != 0) {
        __format = "%s:\n  Input: %s\n  Checksum: %s\n";
        goto LAB_00106bc4;
      }
      wally_free_string(pcVar9);
      wally_free_string(hex);
      uVar11 = (ulong)local_26c;
    }
    else {
      pcVar13 = "wally_descriptor_to_scriptpubkey NG[%d]\n";
LAB_00106af6:
      printf(pcVar13,(ulong)uVar5);
LAB_00106aff:
      uVar11 = 0;
      printf("[%s] test failed!\n",*(undefined8 *)((long)&g_descriptor_test_table[0].name + lVar15))
      ;
    }
    lVar15 = lVar15 + 0x28;
  } while (lVar15 != 0x4d8);
  lVar15 = 0;
  do {
    pcVar13 = *(char **)((long)&g_descriptor_depth_test_table[0].name + lVar15);
    pcVar9 = *(char **)((long)&g_descriptor_depth_test_table[0].descriptor + lVar15);
    pcVar2 = *(char **)((long)&g_descriptor_depth_test_table[0].scriptpubkey + lVar15);
    written = 0;
    hex = (char *)0x0;
    uVar5 = wally_descriptor_to_scriptpubkey
                      (pcVar9,g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,0,0,
                       *(uint32_t *)((long)&g_descriptor_depth_test_table[0].depth + lVar15),
                       *(uint32_t *)((long)&g_descriptor_depth_test_table[0].index + lVar15),0,
                       script,0x208,&written);
    if (uVar5 == 0) {
      local_268 = (wally_descriptor_address_list_test *)pcVar2;
      local_258 = pcVar13;
      uVar5 = wally_hex_from_bytes(script,written,&hex);
      pcVar13 = hex;
      if (uVar5 != 0) {
        pcVar13 = "wally_hex_from_bytes NG[%d]\n";
        goto LAB_00106c9d;
      }
      sVar8 = strlen(hex);
      iVar7 = strncmp(pcVar13,(char *)local_268,sVar8 + 1);
      if (iVar7 != 0) {
        printf("%s:\n  Input: %s\n  Output: %s\n",local_258,pcVar9,pcVar13);
        wally_free_string(hex);
        goto LAB_00106ca6;
      }
      wally_free_string(pcVar13);
    }
    else {
      pcVar13 = "wally_descriptor_to_scriptpubkey NG[%d]\n";
LAB_00106c9d:
      printf(pcVar13,(ulong)uVar5);
LAB_00106ca6:
      uVar11 = 0;
      printf("[%s] keylist test failed!\n",
             *(undefined8 *)((long)&g_descriptor_depth_test_table[0].name + lVar15));
    }
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0xe0);
  lVar15 = 0;
  do {
    uVar3 = *(undefined8 *)((long)&g_descriptor_address_test_table[0].name + lVar15);
    pcVar13 = *(char **)((long)&g_descriptor_address_test_table[0].address + lVar15);
    script[0] = '\0';
    script[1] = '\0';
    script[2] = '\0';
    script[3] = '\0';
    script[4] = '\0';
    script[5] = '\0';
    script[6] = '\0';
    script[7] = '\0';
    uVar5 = wally_descriptor_to_address
                      (*(char **)((long)&g_descriptor_address_test_table[0].descriptor + lVar15),
                       g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,
                       *(uint32_t *)((long)&g_descriptor_address_test_table[0].bip32_index + lVar15)
                       ,*(uint32_t *)((long)&g_descriptor_address_test_table[0].network + lVar15),0,
                       (char **)script);
    __s2 = script._0_8_;
    if (uVar5 == 0) {
      sVar8 = strlen(pcVar13);
      iVar7 = strncmp(pcVar13,(char *)__s2,sVar8 + 1);
      if (iVar7 != 0) {
        printf("%s:\n  Address: %s\n  Expect: %s\n",uVar3,__s2,pcVar13);
        wally_free_string((char *)script._0_8_);
        goto LAB_00106dce;
      }
      wally_free_string((char *)__s2);
    }
    else {
      printf("wally_descriptor_to_address NG[%d]\n",(ulong)uVar5);
LAB_00106dce:
      uVar11 = 0;
      printf("[%s] test failed!\n",
             *(undefined8 *)((long)&g_descriptor_address_test_table[0].name + lVar15));
    }
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0x3c0);
  uVar5 = 0x301;
  lVar15 = 0;
  local_26c = (uint)uVar11;
  do {
    local_268 = g_descriptor_addresses_test_table + lVar15;
    pcVar13 = g_descriptor_addresses_test_table[lVar15].name;
    uVar12 = (ulong)g_descriptor_addresses_test_table[lVar15].start_index;
    uVar11 = g_descriptor_addresses_test_table[lVar15].address_list_num;
    script[0] = '\0';
    script[1] = '\0';
    script[2] = '\0';
    script[3] = '\0';
    script[4] = '\0';
    script[5] = '\0';
    script[6] = '\0';
    script[7] = '\0';
    script[8] = '\0';
    script[9] = '\0';
    script[10] = '\0';
    script[0xb] = '\0';
    script[0xc] = '\0';
    script[0xd] = '\0';
    script[0xe] = '\0';
    script[0xf] = '\0';
    uVar6 = wally_descriptor_to_addresses
                      (g_descriptor_addresses_test_table[lVar15].descriptor,
                       g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,
                       g_descriptor_addresses_test_table[lVar15].start_index,
                       g_descriptor_addresses_test_table[lVar15].end_index,
                       g_descriptor_addresses_test_table[lVar15].network,0,
                       (wally_descriptor_addresses *)script);
    if (uVar6 == 0) {
      local_240 = uVar12;
      if (script._8_8_ == uVar11) {
        if (uVar11 != 0) {
          bVar14 = true;
          uVar12 = 0;
          local_258 = pcVar13;
          local_24c = uVar5;
          do {
            while( true ) {
              pcVar13 = local_268->address_list[uVar12];
              pcVar9 = *(char **)(script._0_8_ + 8 + uVar12 * 0x18);
              uVar5 = *(uint *)(script._0_8_ + uVar12 * 0x18);
              sVar8 = strlen(pcVar13);
              iVar7 = strncmp(pcVar13,pcVar9,sVar8 + 1);
              iVar10 = (int)uVar12;
              if (iVar7 != 0) {
                bVar14 = false;
                printf("%s:\n  Address[%u]: %s\n  Expect: %s\n",local_258,uVar12,pcVar9,pcVar13);
              }
              if (uVar5 != iVar10 + (int)local_240) break;
              uVar12 = (ulong)(iVar10 + 1);
              if (uVar11 <= uVar12) {
                wally_free_descriptor_addresses((wally_descriptor_addresses *)script);
                uVar6 = local_24c;
                uVar5 = local_24c;
                if (bVar14) goto LAB_00106fa8;
                goto LAB_00106e85;
              }
            }
            bVar14 = false;
            printf("%s:\n  childNum[%u]: %u\n  Expect: %u\n",local_258,uVar12,(ulong)uVar5);
            uVar12 = (ulong)(iVar10 + 1);
          } while (uVar12 < uVar11);
          wally_free_descriptor_addresses((wally_descriptor_addresses *)script);
          uVar5 = local_24c;
          goto LAB_00106e85;
        }
      }
      else {
        printf("%s:\n  Address length: %zu\n  Expect: %zu\n",pcVar13,script._8_8_,uVar11);
      }
      wally_free_descriptor_addresses((wally_descriptor_addresses *)script);
      uVar6 = uVar5;
    }
    else {
      printf("wally_descriptor_to_addresses NG[%d]\n",(ulong)uVar6);
LAB_00106e85:
      local_26c = 0;
      printf("[%s] test failed!\n",local_268->name);
      uVar6 = uVar5;
    }
LAB_00106fa8:
    lVar15 = 1;
    uVar5 = 0;
    if ((uVar6 & 1) == 0) {
      lVar15 = 0;
      uVar5 = local_26c;
      do {
        uVar3 = *(undefined8 *)((long)&g_descriptor_err_test_table[0].name + lVar15);
        written = 0;
        uVar6 = wally_descriptor_to_scriptpubkey
                          (*(char **)((long)&g_descriptor_err_test_table[0].descriptor + lVar15),
                           g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,0,
                           *(uint32_t *)((long)&g_descriptor_err_test_table[0].network + lVar15),0,0
                           ,0,script,0x208,&written);
        if (uVar6 != 0xfffffffe) {
          if (uVar6 == 0) {
            printf("wally_descriptor_to_scriptpubkey Fail[Not Error] name[%s]\n",uVar3);
          }
          else {
            printf("wally_descriptor_to_scriptpubkey NG[%d]\n",(ulong)uVar6);
          }
          uVar5 = 0;
          printf("[%s] test failed!\n",
                 *(undefined8 *)((long)&g_descriptor_err_test_table[0].name + lVar15));
        }
        lVar15 = lVar15 + 0x18;
      } while (lVar15 != 0x1b0);
      lVar15 = 0;
      do {
        uVar3 = *(undefined8 *)((long)&g_address_err_test_table[0].name + lVar15);
        script[0] = '\0';
        script[1] = '\0';
        script[2] = '\0';
        script[3] = '\0';
        script[4] = '\0';
        script[5] = '\0';
        script[6] = '\0';
        script[7] = '\0';
        uVar6 = wally_descriptor_to_address
                          (*(char **)((long)&g_address_err_test_table[0].descriptor + lVar15),
                           g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,0,
                           *(uint32_t *)((long)&g_address_err_test_table[0].network + lVar15),0,
                           (char **)script);
        if (uVar6 != 0xfffffffe) {
          if (uVar6 == 0) {
            printf("wally_descriptor_to_address Fail[Not Error] name[%s]\n",uVar3);
            wally_free_string((char *)script._0_8_);
          }
          else {
            printf("wally_descriptor_to_address NG[%d]\n",(ulong)uVar6);
          }
          uVar5 = 0;
          printf("[%s] test failed!\n",
                 *(undefined8 *)((long)&g_address_err_test_table[0].name + lVar15));
        }
        lVar15 = lVar15 + 0x18;
      } while (lVar15 != 0x78);
      return (int)(~(byte)uVar5 & 1);
    }
  } while( true );
}

Assistant:

int main(void)
{
    bool tests_ok = true;
    size_t index;
    size_t miniscript_ref_max = sizeof(g_miniscript_ref_test_table) / sizeof(struct wally_miniscript_ref_test);
    size_t miniscript_max = sizeof(g_miniscript_test_table) / sizeof(struct wally_miniscript_test);
    size_t miniscript_tr_max = sizeof(g_miniscript_taproot_test_table) / sizeof(struct wally_miniscript_taproot_test);
    size_t desc_max = sizeof(g_descriptor_test_table) / sizeof(struct wally_descriptor_test);
    size_t desc_depth_max = sizeof(g_descriptor_depth_test_table) / sizeof(struct wally_descriptor_depth_test);
    size_t addr_max = sizeof(g_descriptor_address_test_table) / sizeof(struct wally_descriptor_address_test);
    size_t addr_list_max = sizeof(g_descriptor_addresses_test_table) / sizeof(struct wally_descriptor_address_list_test);
    size_t desc_err_max = sizeof(g_descriptor_err_test_table) / sizeof(struct wally_descriptor_err_test);
    size_t addr_err_max = sizeof(g_address_err_test_table) / sizeof(struct wally_descriptor_err_test);

    for (index = 0; index < miniscript_ref_max; ++index) {
        if (!check_parse_miniscript(
                g_miniscript_ref_test_table[index].miniscript,
                g_miniscript_ref_test_table[index].miniscript,
                g_miniscript_ref_test_table[index].scriptpubkey,
                NULL, NULL, 0, 0)) {
            printf("[%s] test failed!\n", g_miniscript_ref_test_table[index].miniscript);
            tests_ok = false;
        }
    }

    for (index = 0; index < miniscript_max; ++index) {
        if (!check_parse_miniscript(
                g_miniscript_test_table[index].name,
                g_miniscript_test_table[index].descriptor,
                g_miniscript_test_table[index].scriptpubkey,
                NULL, NULL, 0, 0)) {
            printf("[%s] test failed!\n", g_miniscript_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < miniscript_tr_max; ++index) {
        if (!check_parse_miniscript(
                g_miniscript_taproot_test_table[index].miniscript,
                g_miniscript_taproot_test_table[index].miniscript,
                g_miniscript_taproot_test_table[index].scriptpubkey,
                NULL, NULL, 0,
                g_miniscript_taproot_test_table[index].flags)) {
            printf("[%s] test failed!\n", g_miniscript_taproot_test_table[index].miniscript);
            tests_ok = false;
        }
    }

    for (index = 0; index < desc_max; ++index) {
        if (!check_descriptor_to_scriptpubkey(
                g_descriptor_test_table[index].name,
                g_descriptor_test_table[index].descriptor,
                g_descriptor_test_table[index].scriptpubkey,
                g_descriptor_test_table[index].bip32_index,
                g_descriptor_test_table[index].checksum)) {
            printf("[%s] test failed!\n", g_descriptor_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < desc_depth_max; ++index) {
        if (!check_descriptor_to_scriptpubkey_depth(
                g_descriptor_depth_test_table[index].name,
                g_descriptor_depth_test_table[index].descriptor,
                g_descriptor_depth_test_table[index].depth,
                g_descriptor_depth_test_table[index].index,
                g_descriptor_depth_test_table[index].scriptpubkey)) {
            printf("[%s] keylist test failed!\n", g_descriptor_depth_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < addr_max; ++index) {
        if (!check_descriptor_to_address(
                g_descriptor_address_test_table[index].name,
                g_descriptor_address_test_table[index].descriptor,
                g_descriptor_address_test_table[index].bip32_index,
                g_descriptor_address_test_table[index].network,
                g_descriptor_address_test_table[index].address)) {
            printf("[%s] test failed!\n", g_descriptor_address_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < addr_list_max; ++index) {
        if (!check_descriptor_to_addresses(
                g_descriptor_addresses_test_table[index].name,
                g_descriptor_addresses_test_table[index].descriptor,
                g_descriptor_addresses_test_table[index].start_index,
                g_descriptor_addresses_test_table[index].end_index,
                g_descriptor_addresses_test_table[index].network,
                g_descriptor_addresses_test_table[index].address_list,
                g_descriptor_addresses_test_table[index].address_list_num)) {
            printf("[%s] test failed!\n", g_descriptor_addresses_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < desc_err_max; ++index) {
        if (!check_descriptor_scriptpubkey_error(
                g_descriptor_err_test_table[index].name,
                g_descriptor_err_test_table[index].descriptor,
                g_descriptor_err_test_table[index].network)) {
            printf("[%s] test failed!\n", g_descriptor_err_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < addr_err_max; ++index) {
        if (!check_descriptor_address_error(
                g_address_err_test_table[index].name,
                g_address_err_test_table[index].descriptor,
                g_address_err_test_table[index].network)) {
            printf("[%s] test failed!\n", g_address_err_test_table[index].name);
            tests_ok = false;
        }
    }

    return tests_ok ? 0 : 1;
}